

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMTimes(void *arkode_mem,N_Vector v,N_Vector z)

{
  SUNMatrix in_RDX;
  void *in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  uint local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,(char *)in_RDX,(ARKodeMem *)in_stack_ffffffffffffffd8,
                                (ARKLsMassMem *)in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0[8].sunctx == (SUNContext)0x0) {
      if ((in_stack_ffffffffffffffd0->sunctx == (SUNContext)0x0) ||
         (*(long *)(*(long *)&in_stack_ffffffffffffffd0->sunctx->own_profiler + 0x40) == 0)) {
        arkProcessError(in_stack_ffffffffffffffd8,0,"ARKLS","arkLsMTimes",
                        "Missing mass matrix-vector product routine");
        local_4 = 0xffffffff;
      }
      else {
        local_4 = SUNMatMatvec(in_RDX,(N_Vector)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
        ;
        if (local_4 == 0) {
          in_stack_ffffffffffffffd0[4].content =
               (void *)((long)in_stack_ffffffffffffffd0[4].content + 1);
        }
        else {
          arkProcessError(in_stack_ffffffffffffffd8,(int)(ulong)local_4,"ARKLS","arkLsMTimes",
                          "Error in SUNMatrix mass matrix-vector product routine");
        }
      }
    }
    else {
      local_4 = (*(code *)in_stack_ffffffffffffffd0[8].sunctx)
                          (in_stack_ffffffffffffffd8->tcur,in_RSI,in_RDX,
                           in_stack_ffffffffffffffd0[9].content);
      if (local_4 == 0) {
        in_stack_ffffffffffffffd0[4].content =
             (void *)((long)in_stack_ffffffffffffffd0[4].content + 1);
      }
      else {
        arkProcessError(in_stack_ffffffffffffffd8,(int)(ulong)local_4,"ARKLS","arkLsMTimes",
                        "Error in user mass matrix-vector product routine");
      }
    }
  }
  return local_4;
}

Assistant:

int arkLsMTimes(void *arkode_mem, N_Vector v, N_Vector z)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMTimes",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* perform multiply by either calling the user-supplied routine
     (default), or asking the SUNMatrix to do the multiply */
  if (arkls_mem->mtimes) {

    /* call user-supplied mtimes routine, increment counter and return */
    retval = arkls_mem->mtimes(v, z, ark_mem->tcur,
                               arkls_mem->mt_data);
    if (retval == 0) {
      arkls_mem->nmtimes++;
    } else {
      arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                      "Error in user mass matrix-vector product routine");
    }
    return(retval);

  } else if (arkls_mem->M) {

    /* try to ask SUNMatrix to do the multiply; increment counter and return */
    if (arkls_mem->M->ops->matvec) {
      retval = SUNMatMatvec(arkls_mem->M, v, z);
      if (retval == 0) {
        arkls_mem->nmtimes++;
      } else {
        arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                        "Error in SUNMatrix mass matrix-vector product routine");
      }
      return(retval);
    }

  }

  /* if we made it here, then no matrix-vector product is available */
  arkProcessError(ark_mem, retval, "ARKLS", "arkLsMTimes",
                  "Missing mass matrix-vector product routine");
  return(-1);
}